

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<unsigned_long,_int,_6>::Multiply
               (unsigned_long *t,int *u,unsigned_long *ret)

{
  bool bVar1;
  undefined8 *in_RDX;
  bool f;
  uint64_t tmp;
  uint64_t t1;
  uint64_t *in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffd4;
  undefined8 uVar2;
  
  uVar2 = 0;
  bVar1 = LargeIntRegMultiply<unsigned_long,_int>::RegMultiply
                    ((uint64_t *)0x0,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  *in_RDX = uVar2;
  return bVar1;
}

Assistant:

static bool Multiply(const T& t, const U& u, T& ret) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<T>::isUint64, "T must be Uint64");
        std::uint64_t t1 = t;
        std::uint64_t tmp = 0;
        bool f = LargeIntRegMultiply< std::uint64_t, std::int32_t >::RegMultiply(t1, (std::int32_t)u, &tmp);
        ret = tmp;
        return f;
    }